

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O1

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> * __thiscall
jsoncons::jsonpointer::detail::
resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (detail *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *current,
          string_view_type *buffer,error_code *ec)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar4;
  jsonpointer_errc __e;
  type tVar5;
  size_t index;
  ulong local_20;
  
  bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     this);
  if (bVar2) {
    if ((*(char **)&current->field_0 != (char *)0x1) ||
       (*(char *)&((current->field_0).long_str_.ptr_)->
                  super_heap_string_base<jsoncons::null_type,_std::allocator<char>_> != '-')) {
      local_20 = 0;
      tVar5 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                        ((detail *)(current->field_0).long_str_.ptr_,*(char **)&current->field_0,
                         (size_t)&local_20,(unsigned_long *)ec);
      uVar1 = local_20;
      if (tVar5.ec != success) {
        __e = invalid_index;
        goto LAB_003b5bf3;
      }
      sVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)this);
      if (uVar1 < sVar3) {
        pbVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)this,local_20);
        return pbVar4;
      }
    }
    __e = index_exceeds_array_size;
  }
  else {
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )this);
    if (bVar2) {
      bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::contains
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)this,(string_view_type *)current);
      if (bVar2) {
        pbVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)this,(string_view_type *)current);
        return pbVar4;
      }
      __e = key_not_found;
    }
    else {
      __e = expected_object_or_array;
    }
  }
LAB_003b5bf3:
  std::error_code::operator=((error_code *)buffer,__e);
  return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this;
}

Assistant:

const Json* resolve(const Json* current, const typename Json::string_view_type& buffer, std::error_code& ec)
    {
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            std::size_t index{0};
            auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
            if (!result)
            {
                ec = jsonpointer_errc::invalid_index;
                return current;
            }
            if (index >= current->size())
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            current = std::addressof(current->at(index));
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                ec = jsonpointer_errc::key_not_found;
                return current;
            }
            current = std::addressof(current->at(buffer));
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return current;
        }
        return current;
    }